

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

void __thiscall
benchmark::internal::BenchmarkImp::DenseRange(BenchmarkImp *this,int start,int limit)

{
  bool bVar1;
  int local_40 [2];
  CheckHandler local_38;
  CheckHandler local_30;
  
  if ((this->arg_count_ != 1) && (this->arg_count_ != -1)) {
    CheckHandler::CheckHandler
              (&local_38,"arg_count_ == -1 || arg_count_ == 1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
               ,"DenseRange",0x1b2);
    CheckHandler::~CheckHandler(&local_38);
  }
  GetNullLogInstance();
  this->arg_count_ = 1;
  if (start < 0) {
    CheckHandler::CheckHandler
              (&local_38,"(start) >= (0)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
               ,"DenseRange",0x1b4);
    CheckHandler::~CheckHandler(&local_38);
  }
  GetNullLogInstance();
  if (limit < start) {
    CheckHandler::CheckHandler
              (&local_30,"(start) <= (limit)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
               ,"DenseRange",0x1b5);
    CheckHandler::~CheckHandler(&local_30);
  }
  GetNullLogInstance();
  local_40[0] = start;
  do {
    local_40[1] = 0xffffffff;
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->args_,
               local_40,local_40 + 1);
    bVar1 = local_40[0] < limit;
    local_40[0] = local_40[0] + 1;
  } while (bVar1);
  return;
}

Assistant:

void BenchmarkImp::DenseRange(int start, int limit) {
  CHECK(arg_count_ == -1 || arg_count_ == 1);
  arg_count_ = 1;
  CHECK_GE(start, 0);
  CHECK_LE(start, limit);
  for (int arg = start; arg <= limit; arg++) {
    args_.emplace_back(arg, -1);
  }
}